

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw_image.cxx
# Opt level: O3

void c565_converter(uchar *from,uchar *to,int w,int delta)

{
  long lVar1;
  unsigned_short *t;
  byte *pbVar2;
  
  lVar1 = 1;
  if (dir == 1) {
    from = from + (w + -1) * delta;
    to = to + (long)w * 2 + -2;
    delta = -delta;
    lVar1 = -1;
  }
  dir = dir ^ 1;
  if (w != 0) {
    pbVar2 = from + 2;
    do {
      ri = (uint)pbVar2[-2] + (ri & 7U);
      if (0xfe < (uint)ri) {
        ri = 0xff;
      }
      gi = (uint)pbVar2[-1] + (gi & 3U);
      if (0xfe < (uint)gi) {
        gi = 0xff;
      }
      bi = (uint)*pbVar2 + (bi & 7U);
      if (0xfe < (uint)bi) {
        bi = 0xff;
      }
      *(ushort *)to =
           (ushort)((uint)bi >> 3) | ((ushort)ri & 0xf8) * 0x100 + ((ushort)gi & 0xfc) * 8;
      to = (uchar *)((long)to + lVar1 * 2);
      pbVar2 = pbVar2 + delta;
      w = w + -1;
    } while (w != 0);
  }
  return;
}

Assistant:

static void c565_converter(const uchar *from, uchar *to, int w, int delta) {
  OUTTYPE *t = (OUTTYPE *)to;
  int d, td;
  if (dir) {
    dir = 0;
    from = from+(w-1)*delta;
    t = t+(w-1)*OUTSIZE;
    d = -delta;
    td = -OUTSIZE;
  } else {
    dir = 1;
    d = delta;
    td = OUTSIZE;
  }
  int r=ri, g=gi, b=bi;
  for (; w--; from += d, t += td) {
    r = (r&7)+from[0]; if (r>255) r = 255;
    g = (g&3)+from[1]; if (g>255) g = 255;
    b = (b&7)+from[2]; if (b>255) b = 255;
    OUTASSIGN(((r&0xf8)<<8) + ((g&0xfc)<<3) + (b>>3));
  }
  ri = r; gi = g; bi = b;
}